

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

JavascriptFunction * __thiscall
Js::ScriptContext::LoadScriptInternal
          (ScriptContext *this,Parser *parser,byte *script,size_t cb,SRCINFO *pSrcInfo,
          CompileScriptException *pse,Utf8SourceInfo **ppSourceInfo,char16 *rootDisplayName,
          LoadScriptFlag loadScriptFlag,Var scriptSource)

{
  code *pcVar1;
  bool bVar2;
  ParseNodeProg *parseTree;
  JavascriptFunction *pJVar3;
  undefined4 *puVar4;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint local_34 [2];
  uint sourceIndex;
  
  local_34[0] = 0xffffffff;
  parseTree = ParseScript(this,parser,script,cb,pSrcInfo,pse,ppSourceInfo,
                          (char16 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          loadScriptFlag,local_34,scriptSource);
  if (parseTree == (ParseNodeProg *)0x0) {
    pJVar3 = (JavascriptFunction *)0x0;
  }
  else {
    pJVar3 = GenerateRootFunction
                       (this,parseTree,local_34[0],parser,(*ppSourceInfo)->parseFlags,pse,
                        rootDisplayName);
  }
  if ((pse->super_ScriptException).ei.scode == -0x7ff5ebe4) {
    if ((loadScriptFlag & LoadScriptFlag_disableAsmJs) != LoadScriptFlag_None) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0xa04,
                                  "((loadScriptFlag & LoadScriptFlag_disableAsmJs) != LoadScriptFlag_disableAsmJs)"
                                  ,
                                  "(loadScriptFlag & LoadScriptFlag_disableAsmJs) != LoadScriptFlag_disableAsmJs"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    CompileScriptException::Free(pse);
    if (local_34[0] != 0xffffffff) {
      RemoveSource(this,local_34[0]);
    }
    pJVar3 = LoadScript(this,script,cb,pSrcInfo,pse,ppSourceInfo,rootDisplayName,
                        loadScriptFlag | LoadScriptFlag_disableAsmJs,scriptSource);
  }
  return pJVar3;
}

Assistant:

JavascriptFunction* ScriptContext::LoadScriptInternal(Parser* parser, const byte* script, size_t cb,
        SRCINFO const * pSrcInfo, CompileScriptException * pse, Utf8SourceInfo** ppSourceInfo,
        const char16 *rootDisplayName, LoadScriptFlag loadScriptFlag, Js::Var scriptSource)
    {
        uint sourceIndex = Constants::InvalidSourceIndex;
        JavascriptFunction * pFunction = nullptr;

        ParseNodeProg * parseTree = ParseScript(parser, script, cb, pSrcInfo,
            pse, ppSourceInfo, rootDisplayName, loadScriptFlag,
            &sourceIndex, scriptSource);

        if (parseTree != nullptr)
        {
            pFunction = GenerateRootFunction(parseTree, sourceIndex, parser, (*ppSourceInfo)->GetParseFlags(), pse, rootDisplayName);
        }

        if (pse->ei.scode == JSERR_AsmJsCompileError)
        {
            Assert((loadScriptFlag & LoadScriptFlag_disableAsmJs) != LoadScriptFlag_disableAsmJs);

            pse->Free();
            if (sourceIndex != Constants::InvalidSourceIndex)
            {
                // If we registered source, we should remove it or we will register another source info
                this->RemoveSource(sourceIndex);
            }
            loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_disableAsmJs);
            return LoadScript(script, cb, pSrcInfo, pse, ppSourceInfo,
                rootDisplayName, loadScriptFlag, scriptSource);
        }

#ifdef ENABLE_SCRIPT_PROFILING
        if (pFunction != nullptr && this->IsProfiling())
        {
            RegisterScript(pFunction->GetFunctionProxy());
        }
#else
        Assert(!this->IsProfiling());
#endif

        return pFunction;
    }